

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O0

bool __thiscall jrtplib::RTCPScheduler::IsTime(RTCPScheduler *this)

{
  bool bVar1;
  int iVar2;
  RTPSourceData *this_00;
  RTPTime RVar3;
  RTPSourceData *srcdat;
  RTPTime RStack_30;
  bool aresender;
  RTPTime checktime;
  RTPTime currenttime;
  RTCPScheduler *this_local;
  
  if ((this->firstcall & 1U) == 0) {
    checktime = RTPTime::CurrentTime();
    bVar1 = RTPTime::operator<(&checktime,&this->nextrtcptime);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      RTPTime::RTPTime(&stack0xffffffffffffffd0,0,0);
      if ((this->byescheduled & 1U) == 0) {
        srcdat._7_1_ = false;
        this_00 = RTPSources::GetOwnSourceInfo(this->sources);
        if (this_00 != (RTPSourceData *)0x0) {
          srcdat._7_1_ = RTPSourceData::IsSender(this_00);
        }
        RStack_30 = CalculateTransmissionInterval(this,srcdat._7_1_);
      }
      else {
        RStack_30 = CalculateBYETransmissionInterval(this);
      }
      RTPTime::operator+=(&stack0xffffffffffffffd0,&this->prevrtcptime);
      bVar1 = RTPTime::operator<=(&stack0xffffffffffffffd0,&checktime);
      if (bVar1) {
        this->byescheduled = false;
        (this->prevrtcptime).m_t = checktime.m_t;
        iVar2 = RTPSources::GetActiveMemberCount(this->sources);
        this->pmembers = iVar2;
        CalculateNextRTCPTime(this);
        this_local._7_1_ = true;
      }
      else {
        (this->nextrtcptime).m_t = RStack_30.m_t;
        iVar2 = RTPSources::GetActiveMemberCount(this->sources);
        this->pmembers = iVar2;
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this->firstcall = false;
    RVar3 = RTPTime::CurrentTime();
    (this->prevrtcptime).m_t = RVar3.m_t;
    iVar2 = RTPSources::GetActiveMemberCount(this->sources);
    this->pmembers = iVar2;
    CalculateNextRTCPTime(this);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RTCPScheduler::IsTime()
{
	if (firstcall)
	{
		firstcall = false;
		prevrtcptime = RTPTime::CurrentTime();
		pmembers = sources.GetActiveMemberCount();
		CalculateNextRTCPTime();
		return false;
	}

	RTPTime currenttime = RTPTime::CurrentTime();

//	// TODO: for debugging
//	double diff = nextrtcptime.GetDouble() - currenttime.GetDouble();
//
//	std::cout << "Delay till next RTCP interval: " << diff << std::endl;
	
	if (currenttime < nextrtcptime) // timer has not yet expired
		return false;

	RTPTime checktime(0,0);
	
	if (!byescheduled)
	{
		bool aresender = false;
		RTPSourceData *srcdat;
		
		if ((srcdat = sources.GetOwnSourceInfo()) != 0)
			aresender = srcdat->IsSender();
		
		checktime = CalculateTransmissionInterval(aresender);
	}
	else
		checktime = CalculateBYETransmissionInterval();
	
//	std::cout << "Calculated checktime: " << checktime.GetDouble() << std::endl;
	
	checktime += prevrtcptime;
	
	if (checktime <= currenttime) // Okay
	{
		byescheduled = false;
		prevrtcptime = currenttime;
		pmembers = sources.GetActiveMemberCount();
		CalculateNextRTCPTime();
		return true;
	}

//	std::cout << "New delay: " << nextrtcptime.GetDouble() - currenttime.GetDouble() << std::endl;
	
	nextrtcptime = checktime;
	pmembers = sources.GetActiveMemberCount();
	
	return false;
}